

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxapp.h
# Opt level: O0

void __thiscall ktxApp::~ktxApp(ktxApp *this)

{
  undefined8 *in_RDI;
  vector<argparser::option,_std::allocator<argparser::option>_> *unaff_retaddr;
  
  *in_RDI = &PTR___cxa_pure_virtual_0014aa48;
  std::__cxx11::string::~string((string *)(in_RDI + 0xb));
  std::vector<argparser::option,_std::allocator<argparser::option>_>::~vector(unaff_retaddr);
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  return;
}

Assistant:

virtual void usage() {
        cerr <<
            "  -h, --help    Print this usage message and exit.\n"
            "  -v, --version Print the version number of this program and exit.\n"
#if defined(_WIN32) && defined(DEBUG)
            "      --ld      Launch Visual Studio deugger at start up.\n"
#endif
            ;
    }